

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_skip_list.c
# Opt level: O0

void test_skiplist_randomized_insert(planck_unit_test_t *tc)

{
  planck_unit_result_t pVar1;
  int iVar2;
  ion_status_t iVar3;
  int next;
  int now;
  ion_sl_node_t *cursor;
  int iStack_60;
  ion_status_t status;
  int key;
  int i;
  ion_byte_t str [10];
  ion_skiplist_t skiplist;
  planck_unit_test_t *tc_local;
  
  initialize_skiplist_std_conditions((ion_skiplist_t *)(str + 2));
  strcpy((char *)((long)&key + 2),"random");
  status.count = 0;
  while( true ) {
    if (99 < status.count) {
      _next = skiplist.super._24_8_;
      while( true ) {
        if (**(long **)(**(long **)(_next + 0x18) + 0x18) == 0) {
          sl_destroy((ion_skiplist_t *)(str + 2));
          return;
        }
        pVar1 = planck_unit_assert_true
                          (tc,(uint)(**(int **)**(undefined8 **)(_next + 0x18) <=
                                    **(int **)**(undefined8 **)(**(long **)(_next + 0x18) + 0x18)),
                           0x131,
                           "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                           ,"condition was false, expected true");
        if (pVar1 == '\0') break;
        _next = **(long **)(_next + 0x18);
      }
      longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
    }
    iVar2 = rand();
    status._0_4_ = iVar2 % 0x65;
    iVar3 = sl_insert((ion_skiplist_t *)(str + 2),&status,(ion_value_t)((long)&key + 2));
    cursor._4_1_ = iVar3.error;
    pVar1 = planck_unit_assert_true
                      (tc,(uint)(cursor._4_1_ == '\0'),0x123,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                       ,"condition was false, expected true");
    if (pVar1 == '\0') break;
    iStack_60 = iVar3.count;
    pVar1 = planck_unit_assert_true
                      (tc,(uint)(iStack_60 == 1),0x124,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                       ,"condition was false, expected true");
    if (pVar1 == '\0') {
      longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
    }
    status.count = status.count + 1;
  }
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
}

Assistant:

void
test_skiplist_randomized_insert(
	planck_unit_test_t *tc
) {
	PRINT_HEADER();

	ion_skiplist_t skiplist;

	initialize_skiplist_std_conditions(&skiplist);

	ion_byte_t str[10];

	strcpy((char *) str, "random");

	int i;

	for (i = 0; i < 100; i++) {
		int key				= rand() % 101;

		ion_status_t status = sl_insert(&skiplist, (ion_key_t) &key, str);

		PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == status.error);
		PLANCK_UNIT_ASSERT_TRUE(tc, 1 == status.count);
	}

#if ION_DEBUG
	print_skiplist(&skip_list);
#endif

	ion_sl_node_t *cursor = skiplist.head;

	while (cursor->next[0]->next[0] != NULL) {
		int now		= *((int *) cursor->next[0]->key);
		int next	= *((int *) cursor->next[0]->next[0]->key);

		PLANCK_UNIT_ASSERT_TRUE(tc, next >= now);

		cursor = cursor->next[0];
	}

	sl_destroy(&skiplist);
}